

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O2

GCPtr<symbols::Object> __thiscall
evaluator::Evaluator::evalAssignExpression(Evaluator *this,Assign *expr,Env *env)

{
  int iVar1;
  long *plVar2;
  Object *obj;
  GCPtr<symbols::Object> leftValue;
  GCPtr<symbols::Object> rightValue;
  allocator<char> local_c9;
  GCPtr<symbols::Object> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  Eval((Evaluator *)&local_c8,&((expr->super_BinaryOp).LeftOp)->super_Node,env);
  iVar1 = (**(local_c8.addr)->_vptr_Object)();
  if (iVar1 == 4) {
    GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,&local_c8);
  }
  else {
    if (local_c8.addr != (Object *)0x0) {
      plVar2 = (long *)__dynamic_cast(local_c8.addr,&symbols::Object::typeinfo,
                                      &symbols::BuiltinObject::typeinfo,0);
      if (plVar2 != (long *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,"AssignError: ",&local_c9);
        (**(code **)(*plVar2 + 0x18))(&local_80,plVar2);
        std::operator+(&local_c0,"can\'t assign \'",&local_80);
        std::operator+(&local_60,&local_c0,"\'");
        newError(this,&local_40,&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_40);
        goto LAB_00117252;
      }
    }
    Eval((Evaluator *)&local_c0,&((expr->super_BinaryOp).RightOp)->super_Node,env);
    iVar1 = (*(code *)**(undefined8 **)local_c0._M_dataplus._M_p)();
    if (iVar1 == 4) {
      GCPtr<symbols::Object>::GCPtr
                ((GCPtr<symbols::Object> *)this,(GCPtr<symbols::Object> *)&local_c0);
    }
    else {
      (*(((expr->super_BinaryOp).LeftOp)->super_Node)._vptr_Node[3])(&local_a0);
      obj = GCPtr<symbols::Object>::unref((GCPtr<symbols::Object> *)&local_c0);
      symbols::Env::put(env,&local_a0,obj);
      std::__cxx11::string::~string((string *)&local_a0);
      GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,&NATIVE_NULL);
    }
    GCPtr<symbols::Object>::~GCPtr((GCPtr<symbols::Object> *)&local_c0);
  }
LAB_00117252:
  GCPtr<symbols::Object>::~GCPtr(&local_c8);
  return (GCPtr<symbols::Object>)(Object *)this;
}

Assistant:

GCPtr<Object> Evaluator::evalAssignExpression(Assign *expr, Env *env){
    auto leftValue = Eval(expr->LeftOp, env);
    if(isError(leftValue)){
        return leftValue;
    }
    if(auto builtin = dynamic_cast<BuiltinObject*>(leftValue.raw())){
        return newError("AssignError: ", "can't assign '" + builtin->toString() + "'");
    }
    auto rightValue = Eval(expr->RightOp, env);
    if(isError(rightValue)){
        return rightValue;
    }
    env->put(expr->LeftOp->toString(), rightValue.unref());
    return NATIVE_NULL;
}